

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rwlock_test.cpp
# Opt level: O3

void __thiscall
SharedMutexTest_TryLockShared_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::WriterPrefer>_>
::~SharedMutexTest_TryLockShared_Test
          (SharedMutexTest_TryLockShared_Test<yamc::alternate::basic_shared_timed_mutex<yamc::rwlock::WriterPrefer>_>
           *this)

{
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(SharedMutexTest, TryLockShared)
{
  yamc::test::phaser phaser(1 + TEST_READER_THREADS);
  TypeParam mtx;
  int data = 0;
  yamc::test::stopwatch<> sw;
  yamc::test::task_runner(
    1 + TEST_READER_THREADS,
    [&](std::size_t id) {
      auto ph = phaser.get(id);
      if (id == 0) {
        // writer-thread
        ASSERT_NO_THROW(mtx.lock());
        ph.advance(1);  // p1
        data = 42;
        WAIT_TICKS;
        ASSERT_NO_THROW(mtx.unlock());
      } else {
        // reader-threads
        ph.await();     // p1
        while (!mtx.try_lock_shared()) {
          std::this_thread::yield();
        }
        EXPECT_EQ(42, data);
        WAIT_TICKS;
        EXPECT_NO_THROW(mtx.unlock_shared());
      }
    });
  EXPECT_LE(TEST_TICKS * 2, sw.elapsed());
}